

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O2

vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> * __thiscall
mxx::all2allv<std::pair<int,double>>
          (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
           *__return_storage_ptr__,mxx *this,
          vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *msgs,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *send_sizes,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes,comm *comm)

{
  long lVar1;
  pointer ppVar2;
  mxx *this_00;
  
  this_00 = *(mxx **)this;
  lVar1 = 0;
  for (ppVar2 = (msgs->
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      ppVar2 != (msgs->
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                )._M_impl.super__Vector_impl_data._M_finish; ppVar2 = (pointer)&ppVar2->second) {
    lVar1 = lVar1 + *(long *)ppVar2;
  }
  if (*(long *)(this + 8) - (long)this_00 >> 4 != lVar1) {
    assert_fail("msgs.size() == std::accumulate(send_sizes.begin(), send_sizes.end(), (size_t)0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/collective.hpp"
                ,0x533,"all2allv");
    this_00 = *(mxx **)this;
  }
  all2allv<std::pair<int,double>>
            (__return_storage_ptr__,this_00,(pair<int,_double> *)msgs,send_sizes,recv_sizes,comm);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> all2allv(const std::vector<T>& msgs, const std::vector<size_t>& send_sizes, const std::vector<size_t>& recv_sizes, const mxx::comm& comm = mxx::comm()) {
    MXX_ASSERT(msgs.size() == std::accumulate(send_sizes.begin(), send_sizes.end(), (size_t)0));
    return all2allv(&msgs[0], send_sizes, recv_sizes, comm);
}